

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

void __thiscall
CompilerContext::compile_conditions
          (CompilerContext *this,SyntaxTree *conds_node,shared_ptr<Label> *else_ptr)

{
  Command *pCVar1;
  unreachable_exception *this_00;
  size_t op;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l_00;
  anon_class_8_1_8991fb9c compile_multi_andor;
  allocator_type local_91;
  CompilerContext *local_90;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_88;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_70;
  anon_union_48_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false>_3
  local_58;
  undefined8 local_28;
  
  local_90 = this;
  switch(conds_node->type_) {
  case NOT:
  case Equal:
  case Greater:
  case GreaterEqual:
  case Lesser:
  case LesserEqual:
    goto switchD_0016d0fa_caseD_16;
  case AND:
    op = 1;
    goto LAB_0016d1c0;
  case OR:
    op = 0x15;
LAB_0016d1c0:
    compile_conditions(SyntaxTree_const&,std::shared_ptr<Label>const&)::$_0::operator()
              (&local_90,conds_node,op);
    goto LAB_0016d1c8;
  case IF:
  case ELSE:
  case WHILE:
  case REPEAT:
  case SWITCH:
  case CASE:
  case DEFAULT:
  case BREAK:
  case CONTINUE:
  case Decrement:
  case Increment:
  case Cast:
switchD_0016d0fa_caseD_19:
    this_00 = (unreachable_exception *)__cxa_allocate_exception(0x10);
    unreachable_exception::unreachable_exception
              (this_00,
               "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/compiler.cpp(631)."
              );
    __cxa_throw(this_00,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
  }
  if (conds_node->type_ != Command) goto switchD_0016d0fa_caseD_19;
switchD_0016d0fa_caseD_16:
  if ((this->program->opt).optimize_andor == false) {
    pCVar1 = (this->commands->andor).ref;
    if (pCVar1 == (Command *)0x0) goto LAB_0016d256;
    local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
    local_28 = 2;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_58;
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::vector(&local_70,__l,&local_91);
    compile_command(this,pCVar1,&local_70,false);
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::~vector(&local_70);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                *)&local_58._tail);
  }
  compile_condition(this,conds_node,false);
LAB_0016d1c8:
  pCVar1 = (this->commands->goto_if_false).ref;
  if (pCVar1 != (Command *)0x0) {
    local_58._0_8_ = (else_ptr->super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_58._8_8_ =
         (else_ptr->super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count + 1;
      }
    }
    local_28 = 6;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_58;
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::vector(&local_88,__l_00,&local_91);
    compile_command(this,pCVar1,&local_88,false);
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::~vector(&local_88);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                *)&local_58._tail);
    return;
  }
LAB_0016d256:
  __assert_fail("!\"ref\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/optional/include/optional/optional.hpp"
                ,0x2ac,
                "auto std::experimental::optional<const Command &>::operator*()::(anonymous class)::operator()() const [T = const Command &]"
               );
}

Assistant:

void CompilerContext::compile_conditions(const SyntaxTree& conds_node, const shared_ptr<Label>& else_ptr)
{
    auto compile_multi_andor = [this](const auto& conds_node, size_t op)
    {
        assert(conds_node.child_count() <= 8);
        compile_command(*this->commands.andor, { conv_int(op + conds_node.child_count() - 2) });
        for(auto& cond : conds_node) compile_condition(*cond);
    };

    switch(conds_node.type())
    {
        // single condition (also see compile_condition)
        case NodeType::NOT:
        case NodeType::Command:
        case NodeType::Equal:
        case NodeType::Greater:
        case NodeType::GreaterEqual:
        case NodeType::Lesser:
        case NodeType::LesserEqual:
            if (!this->program.opt.optimize_andor)
                compile_command(*this->commands.andor, { conv_int(0) });
            compile_condition(conds_node);
            break;
        case NodeType::AND: // 1-8
            compile_multi_andor(conds_node, 1);
            break;
        case NodeType::OR: // 21-28
            compile_multi_andor(conds_node, 21);
            break;
        default:
            Unreachable();
    }

    compile_command(*this->commands.goto_if_false, { else_ptr });
}